

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

bool __thiscall
mp::internal::SolverAppOptionParser::ShowSolverOptionsASL::OptionASLNameLess::operator()
          (OptionASLNameLess *this,SolverOption *lhs,SolverOption *rhs)

{
  pointer pbVar1;
  int iVar2;
  OptionASLNameLess *pOVar3;
  pointer pbVar4;
  
  pOVar3 = this + 8;
  if (*(OptionASLNameLess **)(this + 0x30) != *(OptionASLNameLess **)(this + 0x28)) {
    pOVar3 = *(OptionASLNameLess **)(this + 0x28);
  }
  pbVar1 = (lhs->inline_synonyms_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = &lhs->name_;
  if ((lhs->inline_synonyms_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar1) {
    pbVar4 = pbVar1;
  }
  iVar2 = strcasecmp(*(char **)pOVar3,(pbVar4->_M_dataplus)._M_p);
  return SUB41((uint)iVar2 >> 0x1f,0);
}

Assistant:

bool operator()(
      const SolverOption* lhs, const SolverOption* rhs) const {
      int cmp = strcasecmp(lhs->name_ASL(), rhs->name_ASL());
      return cmp < 0;
    }